

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

void __thiscall
cs_impl::cni_helper<void_(*)(bool),_void_(*)(bool)>::_call<0>
          (cni_helper<void_(*)(bool),_void_(*)(bool)> *this,vector *args,sequence<0> *param_2)

{
  bool __args;
  
  __args = try_convert_and_check<bool,_bool,_bool,_0UL>::convert
                     ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>).
                      _M_impl.super__Vector_impl_data._M_start);
  std::function<void_(bool)>::operator()(&this->mFunc,__args);
  return;
}

Assistant:

void _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...);
		}